

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O0

void PDHG_Update_Iterate_Constant_Step_Size(CUPDLPwork *pdhg)

{
  long in_RDI;
  CUPDLPvec *atyUpdate;
  CUPDLPvec *axUpdate;
  CUPDLPvec *yUpdate;
  CUPDLPvec *xUpdate;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  CUPDLPstepsize *stepsize;
  CUPDLPiterates *iterates;
  CUPDLPproblem *problem;
  CUPDLPwork *w;
  CUPDLPwork *ATy;
  CUPDLPwork *y_00;
  CUPDLPwork *aty_00;
  CUPDLPwork *w_00;
  CUPDLPwork *yUpdate_00;
  CUPDLPwork *work;
  
  w = *(CUPDLPwork **)(in_RDI + 0x18);
  ATy = w;
  y_00 = w;
  aty_00 = w;
  w_00 = w;
  yUpdate_00 = w;
  work = w;
  Ax(w,(CUPDLPvec *)w,(CUPDLPvec *)w);
  ::ATy(w_00,(CUPDLPvec *)aty_00,(CUPDLPvec *)y_00);
  PDHG_primalGradientStep
            (w_00,(CUPDLPvec *)aty_00,(CUPDLPvec *)y_00,(CUPDLPvec *)ATy,(cupdlp_float)w);
  Ax(w_00,(CUPDLPvec *)aty_00,(CUPDLPvec *)y_00);
  PDHG_dualGradientStep
            (work,(CUPDLPvec *)yUpdate_00,(CUPDLPvec *)w_00,(CUPDLPvec *)aty_00,(CUPDLPvec *)y_00,
             (cupdlp_float)ATy);
  ::ATy(w_00,(CUPDLPvec *)aty_00,(CUPDLPvec *)y_00);
  return;
}

Assistant:

void PDHG_Update_Iterate_Constant_Step_Size(CUPDLPwork *pdhg) {
  //            CUPDLP_ASSERT(0);
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;

  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];
  CUPDLPvec *axUpdate = iterates->ax[(iter + 1) % 2];
  CUPDLPvec *atyUpdate = iterates->aty[(iter + 1) % 2];

  Ax(pdhg, ax, x);
  ATy(pdhg, aty, y);

  // x^{k+1} = proj_{X}(x^k - dPrimalStep * (c - A'y^k))
  PDHG_primalGradientStep(pdhg, xUpdate, x, aty, stepsize->dPrimalStep);

  Ax(pdhg, axUpdate, xUpdate);

  // y^{k+1} = proj_{Y}(y^k + dDualStep * (b - A * (2 x^{k+1} - x^{k})))
  PDHG_dualGradientStep(pdhg, yUpdate, y, ax, axUpdate, stepsize->dDualStep);

  ATy(pdhg, atyUpdate, yUpdate);
}